

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O0

SMatrix<double,_3,_3> * __thiscall
gmath::SMatrix<double,_3,_3>::operator+(SMatrix<double,_3,_3> *this,SMatrix<double,_3,_3> *a)

{
  long in_RDX;
  long in_RSI;
  SMatrix<double,_3,_3> *in_RDI;
  int i;
  int k;
  SMatrix<double,_3,_3> *ret;
  int local_20;
  int local_1c;
  
  SMatrix(in_RDI);
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      in_RDI->v[local_1c][local_20] =
           *(double *)(in_RSI + (long)local_1c * 0x18 + (long)local_20 * 8) +
           *(double *)(in_RDX + (long)local_1c * 0x18 + (long)local_20 * 8);
    }
  }
  return in_RDI;
}

Assistant:

SMatrix<T, nrows, ncols> operator+(const SMatrix<T, nrows, ncols> &a) const
    {
      SMatrix<T, nrows, ncols> ret;

      for (int k=0; k<nrows; k++)
        for (int i=0; i<ncols; i++)
        {
          ret.v[k][i]=v[k][i]+a.v[k][i];
        }

      return ret;
    }